

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O1

SUNErrCode SUNLinSolSpace_SPBCGS(SUNLinearSolver S,long *lenrwLS,long *leniwLS)

{
  long lVar1;
  sunindextype lrw1;
  sunindextype liw1;
  long local_20;
  long local_18;
  
  lVar1 = *(long *)((long)S->content + 0x88);
  if (*(long *)(*(long *)(lVar1 + 8) + 0x20) == 0) {
    local_18 = 0;
    local_20 = 0;
  }
  else {
    N_VSpace(lVar1,&local_20,&local_18);
  }
  *lenrwLS = local_20 * 9;
  *leniwLS = local_18 * 9;
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSpace_SPBCGS(SUNLinearSolver S, long int* lenrwLS,
                                 long int* leniwLS)
{
  SUNFunctionBegin(S->sunctx);
  sunindextype liw1, lrw1;
  if (SPBCGS_CONTENT(S)->vtemp->ops->nvspace)
  {
    N_VSpace(SPBCGS_CONTENT(S)->vtemp, &lrw1, &liw1);
    SUNCheckLastErr();
  }
  else { lrw1 = liw1 = 0; }
  *lenrwLS = lrw1 * 9;
  *leniwLS = liw1 * 9;
  return SUN_SUCCESS;
}